

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O2

bool Assimp::Blender::read<Assimp::Blender::MLoopUV>
               (Structure *s,MLoopUV *p,size_t cnt,FileDatabase *db)

{
  float *pfVar1;
  bool bVar2;
  MLoopUV read;
  MLoopUV local_50;
  
  pfVar1 = p->uv;
  while (bVar2 = cnt != 0, cnt = cnt - 1, bVar2) {
    local_50.super_ElemBase.dna_type = (char *)0x0;
    local_50.super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_007344f0;
    Structure::Convert<Assimp::Blender::MLoopUV>(s,&local_50,db);
    *(char **)(pfVar1 + -2) = local_50.super_ElemBase.dna_type;
    *(float (*) [2])pfVar1 = local_50.uv;
    pfVar1[2] = (float)local_50.flag;
    pfVar1 = pfVar1 + 8;
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }